

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O2

PostDominatorAnalysis * __thiscall
spvtools::opt::IRContext::GetPostDominatorAnalysis(IRContext *this,Function *f)

{
  map<const_spvtools::opt::Function_*,_spvtools::opt::PostDominatorAnalysis,_std::less<const_spvtools::opt::Function_*>,_std::allocator<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::PostDominatorAnalysis>_>_>
  *this_00;
  iterator iVar1;
  DominatorTree *this_01;
  CFG *cfg;
  mapped_type *pmVar2;
  Function *local_28;
  
  local_28 = f;
  if ((this->valid_analyses_ & kAnalysisDominatorAnalysis) == kAnalysisNone) {
    ResetDominatorAnalysis(this);
  }
  this_00 = &this->post_dominator_trees_;
  iVar1 = std::
          _Rb_tree<const_spvtools::opt::Function_*,_std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::PostDominatorAnalysis>,_std::_Select1st<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::PostDominatorAnalysis>_>,_std::less<const_spvtools::opt::Function_*>,_std::allocator<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::PostDominatorAnalysis>_>_>
          ::find(&this_00->_M_t,&local_28);
  if ((_Rb_tree_header *)iVar1._M_node ==
      &(this->post_dominator_trees_)._M_t._M_impl.super__Rb_tree_header) {
    this_01 = (DominatorTree *)
              std::
              map<const_spvtools::opt::Function_*,_spvtools::opt::PostDominatorAnalysis,_std::less<const_spvtools::opt::Function_*>,_std::allocator<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::PostDominatorAnalysis>_>_>
              ::operator[](this_00,&local_28);
    cfg = IRContext::cfg(this);
    DominatorTree::InitializeTree(this_01,cfg,local_28);
  }
  pmVar2 = std::
           map<const_spvtools::opt::Function_*,_spvtools::opt::PostDominatorAnalysis,_std::less<const_spvtools::opt::Function_*>,_std::allocator<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::PostDominatorAnalysis>_>_>
           ::operator[](this_00,&local_28);
  return pmVar2;
}

Assistant:

PostDominatorAnalysis* IRContext::GetPostDominatorAnalysis(const Function* f) {
  if (!AreAnalysesValid(kAnalysisDominatorAnalysis)) {
    ResetDominatorAnalysis();
  }

  if (post_dominator_trees_.find(f) == post_dominator_trees_.end()) {
    post_dominator_trees_[f].InitializeTree(*cfg(), f);
  }

  return &post_dominator_trees_[f];
}